

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

void __thiscall inja::Renderer::render_to(Renderer *this,ostream *os,Template *tmpl,json *data)

{
  Bytecode *bc;
  pointer ppbVar1;
  value_t vVar2;
  Op OVar3;
  pointer pbVar4;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
  *this_00;
  pointer pLVar5;
  array_t *paVar6;
  pointer pcVar7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *pbVar8;
  json_value jVar9;
  pointer ppVar10;
  pointer ppVar11;
  double dVar12;
  string_view name;
  size_type sVar13;
  _Any_data *p_Var14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined8 uVar17;
  char cVar18;
  bool bVar19;
  int iVar20;
  pointer pBVar21;
  json *pjVar22;
  const_iterator cVar23;
  ulong uVar24;
  int *piVar25;
  long lVar26;
  reference pbVar27;
  long *plVar28;
  const_reference pvVar29;
  undefined8 *puVar30;
  pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>
  *ppVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar32;
  key_type *__args;
  reference pbVar33;
  reference this_01;
  vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  *pvVar34;
  undefined8 uVar35;
  uint uVar36;
  vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  *this_02;
  ulong uVar37;
  long *plVar38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar39;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar40;
  undefined1 uVar41;
  char cVar42;
  LoopLevel *pLVar43;
  pointer ppbVar44;
  uint __val;
  ulong uVar45;
  bool bVar46;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  result_8;
  iterator end;
  iterator parent_loop_it;
  vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
  args_12;
  bool result_21;
  bool result_23;
  undefined1 local_2b8 [8];
  json_value jStack_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Any_data local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_> local_250;
  void *local_230;
  undefined1 local_218 [16];
  undefined1 local_208 [24];
  undefined8 uStack_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e8;
  new_allocator<inja::Renderer::LoopLevel> *local_1e0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *local_1d8;
  ostream *local_1d0;
  undefined1 local_1c8 [24];
  primitive_iterator_t pStack_1b0;
  json *local_1a0;
  pointer *local_198;
  uint local_190;
  undefined4 uStack_18c;
  pointer local_188 [2];
  long *local_178;
  long local_170;
  long local_168;
  long lStack_160;
  Template *local_158;
  undefined1 local_150 [8];
  json_value local_148;
  undefined1 *local_140 [2];
  undefined1 local_130 [16];
  undefined1 local_120 [8];
  json_value local_118;
  undefined1 local_110 [8];
  json_value local_108;
  undefined1 local_100 [8];
  json_value local_f8;
  const_iterator local_f0;
  const_iterator local_d0;
  const_iterator local_b0;
  const_iterator local_90;
  const_iterator local_70;
  const_iterator local_50;
  
  this->m_data = data;
  pBVar21 = (tmpl->bytecodes).super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((tmpl->bytecodes).super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
      super__Vector_impl_data._M_finish != pBVar21) {
    local_1e0 = (new_allocator<inja::Renderer::LoopLevel> *)&this->m_loop_stack;
    this_02 = &this->m_stack;
    uVar45 = 0;
    local_1d0 = os;
    local_1a0 = data;
    local_158 = tmpl;
    do {
      paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_208 + 0x10);
      bc = pBVar21 + uVar45;
      switch(pBVar21[uVar45].op) {
      case Nop:
        break;
      case PrintText:
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1d0,(bc->str)._M_dataplus._M_p,(bc->str)._M_string_length);
        break;
      case PrintValue:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        pbVar8 = *(pvVar34->
                  super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if (pbVar8->m_type == string) {
          pbVar32 = nlohmann::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    ::
                    get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                              (pbVar8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1d0,(pbVar32->_M_dataplus)._M_p,pbVar32->_M_string_length);
        }
        else {
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::dump((string_t *)&local_278,pbVar8,-1,' ',false,strict);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1d0,(char *)local_278._M_unused._0_8_,local_278._8_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_unused._0_8_ != &local_268) {
            operator_delete(local_278._M_unused._M_object);
          }
        }
        pop_args(this,bc);
        break;
      case Push:
        pjVar22 = get_imm_abi_cxx11_(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,pjVar22);
        break;
      case Not:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        bVar46 = truthy(this,*(pvVar34->
                              super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        local_278._M_pod_data[0] = !bVar46;
        goto LAB_001b03e9;
      case And:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        bVar46 = truthy(this,*local_278._M_unused._M_object);
        if (bVar46) {
          bVar46 = truthy(this,(json *)((json_value *)(local_278._M_unused._M_function_pointer + 8))
                                       ->object);
        }
        else {
          bVar46 = false;
        }
        local_298[0] = bVar46;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_298);
        goto LAB_001b052e;
      case Or:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        bVar46 = truthy(this,*local_278._M_unused._M_object);
        bVar19 = true;
        if (!bVar46) {
          bVar19 = truthy(this,(json *)((json_value *)(local_278._M_unused._M_function_pointer + 8))
                                       ->object);
        }
        local_298[0] = bVar19;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_298);
        goto LAB_001b052e;
      case In:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_208,pvVar34);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cbegin(&local_d0,
                 (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  *)((json_value *)(local_208._0_8_ + 8))->object);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cend(&local_f0,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)((json_value *)(local_208._0_8_ + 8))->object);
        pvVar29 = *(const_reference *)local_208._0_8_;
        local_288._M_allocated_capacity = (size_type)local_f0.m_it.array_iterator._M_current;
        local_288._8_8_ = local_f0.m_it.primitive_iterator.m_it;
        local_298._0_8_ = local_f0.m_object;
        local_298._8_8_ = local_f0.m_it.object_iterator._M_node;
        local_2a8._M_allocated_capacity = (size_type)local_d0.m_it.array_iterator._M_current;
        local_2a8._8_8_ = local_d0.m_it.primitive_iterator.m_it;
        local_2b8 = (undefined1  [8])local_d0.m_object;
        jStack_2b0 = (json_value)local_d0.m_it.object_iterator._M_node;
        bVar46 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)local_2b8,
                              (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)local_298);
        while (bVar46 == false) {
          local_268._M_allocated_capacity = local_2a8._M_allocated_capacity;
          local_268._8_8_ = local_2a8._8_8_;
          local_278._M_unused._M_object = (void *)local_2b8;
          local_278._8_8_ = jStack_2b0;
          pbVar27 = nlohmann::detail::
                    iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)&local_278);
          bVar46 = nlohmann::operator==(pbVar27,pvVar29);
          if (bVar46) break;
          nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator++((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                        *)local_2b8);
          bVar46 = nlohmann::detail::
                   iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)local_2b8,
                                (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)local_298);
        }
        local_1c8._16_8_ = local_2a8._M_allocated_capacity;
        pStack_1b0.m_it = local_2a8._8_8_;
        local_1c8._0_8_ = local_2b8;
        local_1c8._8_8_ = jStack_2b0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cend((const_iterator *)&local_278,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)((json_value *)(local_208._0_8_ + 8))->object);
        bVar46 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)local_1c8,
                              (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_278);
        local_178 = (long *)CONCAT71(local_178._1_7_,!bVar46);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)&local_178);
        uVar35 = local_208._0_8_;
        goto joined_r0x001aff16;
      case Equal:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        bVar46 = nlohmann::operator==
                           (*local_278._M_unused._M_object,
                            (const_reference)
                            ((json_value *)(local_278._M_unused._M_function_pointer + 8))->object);
        local_298[0] = bVar46;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_298);
        goto LAB_001b052e;
      case Greater:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        bVar46 = nlohmann::operator<((const_reference)
                                     ((json_value *)(local_278._M_unused._M_function_pointer + 8))->
                                     object,*local_278._M_unused._M_object);
        local_298[0] = bVar46;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_298);
        goto LAB_001b052e;
      case GreaterEqual:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        bVar46 = nlohmann::operator<(*local_278._M_unused._M_object,
                                     (const_reference)
                                     ((json_value *)(local_278._M_unused._M_function_pointer + 8))->
                                     object);
        local_298[0] = !bVar46;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_298);
        goto LAB_001b052e;
      case Less:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        bVar46 = nlohmann::operator<(*local_278._M_unused._M_object,
                                     (const_reference)
                                     ((json_value *)(local_278._M_unused._M_function_pointer + 8))->
                                     object);
        local_298[0] = bVar46;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_298);
        goto LAB_001b052e;
      case LessEqual:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        bVar46 = nlohmann::operator<((const_reference)
                                     ((json_value *)(local_278._M_unused._M_function_pointer + 8))->
                                     object,*local_278._M_unused._M_object);
        local_298[0] = !bVar46;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_298);
        goto LAB_001b052e;
      case Different:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        bVar46 = nlohmann::operator==
                           (*local_278._M_unused._M_object,
                            (const_reference)
                            ((json_value *)(local_278._M_unused._M_function_pointer + 8))->object);
        local_298[0] = !bVar46;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_298);
LAB_001b052e:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_unused._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_278._M_unused._M_object);
        }
        break;
      case DivisibleBy:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (*local_278._M_unused._M_object,(int *)local_298);
        uVar15 = local_298._0_4_;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)((json_value *)(local_278._M_unused._M_function_pointer + 8))->object,
                   (int *)local_298);
        uVar16 = local_298._0_4_;
        pop_args(this,bc);
        local_298[0] = uVar16 != 0 && (int)uVar15 % (int)uVar16 == 0;
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::emplace_back<bool>(this_02,(bool *)local_298);
        goto LAB_001b05ba;
      case Even:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (*(pvVar34->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start,(int *)local_278._M_pod_data);
        uVar41 = local_278._M_pod_data[0];
        pop_args(this,bc);
        uVar41 = ~uVar41;
        goto LAB_001affcf;
      case First:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cbegin((const_iterator *)&local_278,
                 *(pvVar34->
                  super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  )._M_impl.super__Vector_impl_data._M_start);
        pbVar27 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_278);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_298,pbVar27);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_298);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_298);
        p_Var14 = (_Any_data *)local_298;
        uVar41 = local_298[0];
        goto LAB_001b0292;
      case Float:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        pbVar32 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            (*(pvVar34->
                              super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar32->_M_dataplus)._M_p;
        piVar25 = __errno_location();
        iVar20 = *piVar25;
        *piVar25 = 0;
        paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)strtod(paVar39->_M_local_buf,(char **)&local_278);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_unused._0_8_ == paVar39) goto LAB_001b1089;
        if (*piVar25 == 0) {
          *piVar25 = iVar20;
        }
        else if (*piVar25 == 0x22) goto LAB_001b1095;
        local_278._M_unused._M_object = paVar40;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<double&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(double *)&local_278);
        break;
      case Int:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        pbVar32 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            (*(pvVar34->
                              super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pbVar32->_M_dataplus)._M_p;
        piVar25 = __errno_location();
        iVar20 = *piVar25;
        *piVar25 = 0;
        lVar26 = strtol(paVar39->_M_local_buf,(char **)&local_278,10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_unused._0_8_ != paVar39) {
          if (((int)lVar26 == lVar26) && (*piVar25 != 0x22)) {
            if (*piVar25 == 0) {
              *piVar25 = iVar20;
            }
            local_278._0_4_ = (int)lVar26;
            pop_args(this,bc);
            std::
            vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
            ::emplace_back<int&>
                      ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                        *)this_02,(int *)local_278._M_pod_data);
            break;
          }
LAB_001b1071:
          std::__throw_out_of_range("stoi");
        }
        std::__throw_invalid_argument("stoi");
LAB_001b1089:
        std::__throw_invalid_argument("stod");
LAB_001b1095:
        uVar35 = std::__throw_out_of_range("stod");
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_unused._0_8_ != &local_268) {
          operator_delete(local_278._M_unused._M_object);
        }
        _Unwind_Resume(uVar35);
      case Last:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        pvVar29 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                  ::back(*(pvVar34->
                          super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)&local_278,pvVar29);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)&local_278);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)&local_278);
        p_Var14 = &local_278;
        uVar41 = local_278._M_pod_data[0];
LAB_001b0292:
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(p_Var14->_M_pod_data + 8),uVar41);
        break;
      case Length:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        pbVar8 = *(pvVar34->
                  super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        vVar2 = pbVar8->m_type;
        local_278._M_unused._0_8_ = (undefined8)(ulong)vVar2;
        if (vVar2 != null) {
          if (vVar2 == object) {
            local_278._M_unused._0_8_ =
                 (undefined8)
                 *(size_t *)
                  ((long)&(((pbVar8->m_value).object)->_M_t)._M_impl.super__Rb_tree_header + 0x20);
          }
          else if (vVar2 == array) {
            local_278._M_unused._0_8_ =
                 (undefined8)
                 ((long)*(pointer *)
                         ((long)&(((pbVar8->m_value).array)->
                                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                                 )._M_impl.super__Vector_impl_data + 8) -
                  *(long *)&(((pbVar8->m_value).array)->
                            super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                            )._M_impl.super__Vector_impl_data >> 4);
          }
          else {
            local_278._M_unused._0_8_ =
                 (undefined8)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x1;
          }
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<unsigned_long&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(unsigned_long *)local_278._M_pod_data);
        break;
      case Lower:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278,
                   *(pvVar34->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start);
        uVar17 = local_278._8_8_;
        uVar35 = local_278._M_unused._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          lVar26 = 0;
          do {
            iVar20 = tolower((int)*(char *)(uVar35 + lVar26));
            *(char *)(uVar35 + lVar26) = (char)iVar20;
            lVar26 = lVar26 + 1;
          } while (uVar17 != lVar26);
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<std::__cxx11::string>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278);
        goto LAB_001af9c3;
      case Max:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_298,pvVar34);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cbegin(&local_50,
                 *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   **)local_298._0_8_);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cend(&local_70,
               *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 **)local_298._0_8_);
        std::
        __max_element<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>,__gnu_cxx::__ops::_Iter_less_iter>
                  (&local_278);
        pbVar27 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_278);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2b8,pbVar27);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2b8);
        goto LAB_001afb57;
      case Min:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_298,pvVar34);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cbegin(&local_90,
                 *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   **)local_298._0_8_);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cend(&local_b0,
               *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 **)local_298._0_8_);
        std::
        __min_element<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>,__gnu_cxx::__ops::_Iter_less_iter>
                  (&local_278);
        pbVar27 = nlohmann::detail::
                  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                  ::operator*((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_278);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_2b8,pbVar27);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_2b8);
LAB_001afb57:
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_2b8);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_2b8 + 8),local_2b8[0]);
        bVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_298._0_8_ ==
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
        uVar35 = local_298._0_8_;
        goto LAB_001afb79;
      case Odd:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (*(pvVar34->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start,(int *)local_278._M_pod_data);
        uVar41 = local_278._M_pod_data[0];
        pop_args(this,bc);
LAB_001affcf:
        local_278._M_unused._M_member_pointer =
             CONCAT71(local_278._1_7_,uVar41) & 0xffffffffffffff01;
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::emplace_back<bool>(this_02,(bool *)local_278._M_pod_data);
        break;
      case Range:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  (*(pvVar34->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start,(int *)local_278._M_pod_data);
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)&local_278,(long)(int)local_278._0_4_,
                   (allocator_type *)local_298);
        if (local_278._M_unused._M_object != (void *)local_278._8_8_) {
          iVar20 = 0;
          uVar35 = local_278._M_unused._0_8_;
          do {
            *(int *)uVar35 = iVar20;
            iVar20 = iVar20 + 1;
            uVar35 = uVar35 + 4;
          } while (uVar35 != local_278._8_8_);
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(vector<int,_std::allocator<int>_> *)&local_278);
LAB_001b05ba:
        uVar35 = local_278._M_unused._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_unused._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) break;
        goto LAB_001b063d;
      default:
        local_278._M_unused._M_object = &local_268;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"render_error","");
        OVar3 = bc->op;
        cVar42 = '\x03' - (OVar3 < 100);
        if (OVar3 < GreaterEqual) {
          cVar42 = '\x01';
        }
        local_2b8 = (undefined1  [8])(local_2b8 + 0x10);
        std::__cxx11::string::_M_construct((ulong)local_2b8,cVar42);
        std::__detail::__to_chars_10_impl<unsigned_int>
                  ((char *)local_2b8,jStack_2b0.number_unsigned._0_4_,(uint)OVar3);
        puVar30 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)local_2b8,0,(char *)0x0,0x487f9e);
        local_298._0_8_ = local_298 + 0x10;
        paVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar30 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar30 == paVar39) {
          local_288._M_allocated_capacity = paVar39->_M_allocated_capacity;
          local_288._8_8_ = puVar30[3];
        }
        else {
          local_288._M_allocated_capacity = paVar39->_M_allocated_capacity;
          local_298._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar30;
        }
        local_298._8_8_ = *(json_value *)(puVar30 + 1);
        *puVar30 = paVar39;
        puVar30[1] = 0;
        *(undefined1 *)(puVar30 + 2) = 0;
        inja_throw((string *)&local_278,(string *)local_298);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_298 + 0x10)) {
          operator_delete((void *)local_298._0_8_);
        }
        if (local_2b8 != (undefined1  [8])(local_2b8 + 0x10)) {
          operator_delete((void *)local_2b8);
        }
        uVar35 = local_278._M_unused._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_unused._0_8_ == &local_268) break;
        goto LAB_001b063d;
      case Round:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)&local_278,pvVar34);
        nlohmann::detail::
        get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_double,_0>
                  (*local_278._M_unused._M_object,(double *)local_298);
        local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_298._0_8_;
        nlohmann::detail::
        from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)((json_value *)(local_278._M_unused._M_function_pointer + 8))->object,
                   (int *)local_298);
        local_1d8 = (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)(double)(int)local_298._0_4_;
        pop_args(this,bc);
        dVar12 = pow(10.0,(double)local_1d8);
        local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)round(dVar12 * (double)local_1e8);
        dVar12 = pow(10.0,(double)local_1d8);
        local_298._0_8_ = (double)local_1e8 / dVar12;
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::emplace_back<double>(this_02,(double *)local_298);
        uVar35 = local_278._M_unused._0_8_;
        goto joined_r0x001aff16;
      case Sort:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_std::vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>,_0>
                  ((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)&local_278,
                   *(pvVar34->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start);
        uVar17 = local_278._8_8_;
        uVar35 = local_278._M_unused._0_8_;
        if (local_278._M_unused._M_object != (void *)local_278._8_8_) {
          uVar37 = (long)(local_278._8_8_ - local_278._0_8_) >> 4;
          lVar26 = 0x3f;
          if (uVar37 != 0) {
            for (; uVar37 >> lVar26 == 0; lVar26 = lVar26 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*,std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_278._M_unused._M_object,local_278._8_8_,((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e)
          ;
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*,std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (uVar35,uVar17);
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                    *)&local_278);
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::~vector((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   *)&local_278);
        break;
      case Upper:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278,
                   *(pvVar34->
                    super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start);
        uVar17 = local_278._8_8_;
        uVar35 = local_278._M_unused._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          lVar26 = 0;
          do {
            iVar20 = toupper((int)*(char *)(uVar35 + lVar26));
            *(char *)(uVar35 + lVar26) = (char)iVar20;
            lVar26 = lVar26 + 1;
          } while (uVar17 != lVar26);
        }
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<std::__cxx11::string>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_278);
LAB_001af9c3:
        bVar46 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_278._M_unused._0_8_ == &local_268;
        uVar35 = local_278._M_unused._0_8_;
LAB_001afb79:
        if (!bVar46) {
          operator_delete((void *)uVar35);
        }
        break;
      case Exists:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        pbVar32 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            (*(pvVar34->
                              super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                              )._M_impl.super__Vector_impl_data._M_start);
        pjVar22 = local_1a0;
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::find<std::__cxx11::string_const&>
                  ((const_iterator *)&local_278,
                   (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                    *)local_1a0,pbVar32);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cend((const_iterator *)local_298,pjVar22);
        bVar46 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_278,(const_iterator *)local_298);
        local_278._M_pod_data[0] = !bVar46;
        pop_args(this,bc);
        goto LAB_001b0406;
      case ExistsInObject:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        std::
        vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
        ::vector((vector<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                  *)local_2b8,pvVar34);
        pbVar32 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)((json_value *)((long)local_2b8 + 8))->object);
        nlohmann::
        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        ::find<std::__cxx11::string_const&>
                  ((const_iterator *)&local_278,
                   *(basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                     **)local_2b8,pbVar32);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::cend((const_iterator *)local_298,
               *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 **)local_2b8);
        bVar46 = nlohmann::detail::
                 iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                 ::operator==((iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                               *)&local_278,(const_iterator *)local_298);
        local_1c8[0] = !bVar46;
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_1c8);
        uVar35 = local_2b8;
joined_r0x001aff16:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)uVar35 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
LAB_001b063d:
          operator_delete((void *)uVar35);
        }
        break;
      case IsBoolean:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        bVar46 = (*(pvVar34->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == boolean;
        goto LAB_001b03dd;
      case IsNumber:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        bVar46 = (byte)((*(pvVar34->
                          super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start)->m_type - number_integer) < 3;
        goto LAB_001af5b1;
      case IsInteger:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        bVar46 = (byte)((*(pvVar34->
                          super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                          )._M_impl.super__Vector_impl_data._M_start)->m_type - number_integer) < 2;
LAB_001af5b1:
        local_278._M_pod_data[0] = bVar46;
        goto LAB_001b03e9;
      case IsFloat:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        bVar46 = (*(pvVar34->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == number_float;
        goto LAB_001b03dd;
      case IsObject:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        bVar46 = (*(pvVar34->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == object;
        goto LAB_001b03dd;
      case IsArray:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        bVar46 = (*(pvVar34->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == array;
        goto LAB_001b03dd;
      case IsString:
        pvVar34 = get_args_abi_cxx11_(this,bc);
        bVar46 = (*(pvVar34->
                   super__Vector_base<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*,_std::allocator<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)->m_type == string;
LAB_001b03dd:
        local_278._M_pod_data[0] = bVar46;
LAB_001b03e9:
        pop_args(this,bc);
LAB_001b0406:
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::emplace_back<bool&>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,(bool *)local_278._M_pod_data);
        break;
      case Default:
        pjVar22 = get_imm_abi_cxx11_(this,bc);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_120,pjVar22);
        pbVar4 = (this->m_stack).
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_120);
        vVar2 = pbVar4[-1].m_type;
        pbVar4[-1].m_type = local_120[0];
        jVar9 = pbVar4[-1].m_value;
        pbVar4[-1].m_value = local_118;
        local_120[0] = vVar2;
        local_118 = jVar9;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pbVar4 + -1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_120);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_120 + 8),local_120[0]);
        break;
      case Include:
        Renderer((Renderer *)&local_278,this->m_included_templates,this->m_callbacks);
        this_00 = &this->m_included_templates->_M_t;
        pjVar22 = get_imm_abi_cxx11_(this,bc);
        pbVar32 = nlohmann::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  ::
                  get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                            (pjVar22);
        cVar23 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
                 ::find(this_00,pbVar32);
        render_to((Renderer *)&local_278,local_1d0,(Template *)(cVar23._M_node + 2),local_1a0);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_218);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_218 + 8),local_218[0]);
        if (local_230 != (void *)0x0) {
          operator_delete(local_230);
        }
        std::vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>::~vector
                  (&local_250);
        std::
        vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::~vector((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   *)&local_268);
        break;
      case Callback:
        name.data_ = (bc->str)._M_dataplus._M_p;
        name.size_ = (bc->str)._M_string_length;
        FunctionStorage::find_callback_abi_cxx11_
                  ((CallbackFunction *)&local_278,this->m_callbacks,name,
                   *(uint *)&bc->field_0x4 & 0x3fffffff);
        if ((code *)local_268._M_allocated_capacity == (code *)0x0) {
          local_298._0_8_ = local_298 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"render_error","");
          local_140[0] = local_130;
          pcVar7 = (bc->str)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_140,pcVar7,pcVar7 + (bc->str)._M_string_length);
          plVar28 = (long *)std::__cxx11::string::replace((ulong)local_140,0,(char *)0x0,0x487f38);
          local_178 = &local_168;
          plVar38 = plVar28 + 2;
          if ((long *)*plVar28 == plVar38) {
            local_168 = *plVar38;
            lStack_160 = plVar28[3];
          }
          else {
            local_168 = *plVar38;
            local_178 = (long *)*plVar28;
          }
          local_170 = plVar28[1];
          *plVar28 = (long)plVar38;
          plVar28[1] = 0;
          *(undefined1 *)(plVar28 + 2) = 0;
          puVar30 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar30 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar30 == paVar40) {
            local_208._16_8_ = paVar40->_M_allocated_capacity;
            uStack_1f0 = puVar30[3];
            local_208._0_8_ = paVar39;
          }
          else {
            local_208._16_8_ = paVar40->_M_allocated_capacity;
            local_208._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar30;
          }
          local_208._8_8_ = puVar30[1];
          *puVar30 = paVar40;
          puVar30[1] = 0;
          *(undefined1 *)(puVar30 + 2) = 0;
          __val = *(uint *)&bc->field_0x4 & 0x3fffffff;
          cVar42 = '\x01';
          if (9 < __val) {
            uVar36 = __val;
            cVar18 = '\x04';
            do {
              cVar42 = cVar18;
              if (uVar36 < 100) {
                cVar42 = cVar42 + -2;
                goto LAB_001b0d96;
              }
              if (uVar36 < 1000) {
                cVar42 = cVar42 + -1;
                goto LAB_001b0d96;
              }
              if (uVar36 < 10000) goto LAB_001b0d96;
              bVar46 = 99999 < uVar36;
              uVar36 = uVar36 / 10000;
              cVar18 = cVar42 + '\x04';
            } while (bVar46);
            cVar42 = cVar42 + '\x01';
          }
LAB_001b0d96:
          local_198 = local_188;
          std::__cxx11::string::_M_construct((ulong)&local_198,cVar42);
          std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_198,local_190,__val);
          ppbVar44 = (pointer)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._0_8_ != paVar39) {
            ppbVar44 = (pointer)local_208._16_8_;
          }
          ppbVar1 = (pointer)(CONCAT44(uStack_18c,local_190) + local_208._8_8_);
          if (ppbVar44 < ppbVar1) {
            ppbVar44 = (pointer)0xf;
            if (local_198 != local_188) {
              ppbVar44 = local_188[0];
            }
            if (ppbVar44 < ppbVar1) goto LAB_001b0e25;
            puVar30 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_198,0,(char *)0x0,local_208._0_8_)
            ;
          }
          else {
LAB_001b0e25:
            puVar30 = (undefined8 *)std::__cxx11::string::_M_append(local_208,(ulong)local_198);
          }
          local_1c8._0_8_ = local_1c8 + 0x10;
          paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar30 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar30 == paVar40) {
            local_1c8._16_8_ = paVar40->_M_allocated_capacity;
            pStack_1b0.m_it = puVar30[3];
          }
          else {
            local_1c8._16_8_ = paVar40->_M_allocated_capacity;
            local_1c8._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*puVar30;
          }
          local_1c8._8_8_ = *(json_value *)(puVar30 + 1);
          *puVar30 = paVar40;
          puVar30[1] = 0;
          paVar40->_M_local_buf[0] = '\0';
          puVar30 = (undefined8 *)std::__cxx11::string::append(local_1c8);
          paVar40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar30 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar30 == paVar40) {
            local_2a8._M_allocated_capacity = paVar40->_M_allocated_capacity;
            local_2a8._8_8_ = puVar30[3];
            local_2b8 = (undefined1  [8])(local_2b8 + 0x10);
          }
          else {
            local_2a8._M_allocated_capacity = paVar40->_M_allocated_capacity;
            local_2b8 = (undefined1  [8])*puVar30;
          }
          jStack_2b0 = *(json_value *)(puVar30 + 1);
          *puVar30 = paVar40;
          puVar30[1] = 0;
          *(undefined1 *)(puVar30 + 2) = 0;
          inja_throw((string *)local_298,(string *)local_2b8);
          if (local_2b8 != (undefined1  [8])(local_2b8 + 0x10)) {
            operator_delete((void *)local_2b8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1c8 + 0x10)) {
            operator_delete((void *)local_1c8._0_8_);
          }
          if (local_198 != local_188) {
            operator_delete(local_198);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._0_8_ != paVar39) {
            operator_delete((void *)local_208._0_8_);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178);
          }
          if (local_140[0] != local_130) {
            operator_delete(local_140[0]);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_298 + 0x10)) {
            operator_delete((void *)local_298._0_8_);
          }
        }
        pvVar34 = get_args_abi_cxx11_(this,bc);
        if ((code *)local_268._M_allocated_capacity == (code *)0x0) {
          std::__throw_bad_function_call();
          goto LAB_001b1071;
        }
        (*(code *)local_268._8_8_)(local_298,&local_278,pvVar34);
        pop_args(this,bc);
        std::
        vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
        ::
        emplace_back<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                  ((vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>
                    *)this_02,
                   (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *)local_298);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_298);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_298 + 8),local_298[0]);
        if ((code *)local_268._M_allocated_capacity != (code *)0x0) {
          (*(code *)local_268._M_allocated_capacity)(&local_278,&local_278,3);
        }
        break;
      case Jump:
switchD_001af15a_caseD_2a:
        uVar45 = (ulong)(*(uint *)&bc->field_0x4 & 0x3fffffff) - 1;
        break;
      case ConditionalJump:
        bVar46 = truthy(this,(this->m_stack).
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
        if (!bVar46) {
          uVar45 = (ulong)(*(uint *)&bc->field_0x4 & 0x3fffffff) - 1;
        }
        pbVar4 = (this->m_stack).
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        (this->m_stack).
        super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant(pbVar4 + -1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)&pbVar4[-1].m_value.boolean,pbVar4[-1].m_type);
        break;
      case StartLoop:
        pbVar4 = (this->m_stack).
                 super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        vVar2 = pbVar4[-1].m_type;
        if (vVar2 == null) {
LAB_001b0657:
          (this->m_stack).
          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(pbVar4 + -1);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&pbVar4[-1].m_value.boolean,pbVar4[-1].m_type);
          uVar45 = (ulong)(*(uint *)&bc->field_0x4 & 0x3fffffff);
        }
        else {
          if (vVar2 == object) {
            bVar46 = ((pbVar4[-1].m_value.object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count
                     == 0;
LAB_001b0650:
            if (bVar46) goto LAB_001b0657;
          }
          else if (vVar2 == array) {
            bVar46 = ((pbVar4[-1].m_value.array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_start ==
                     ((pbVar4[-1].m_value.array)->
                     super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            goto LAB_001b0650;
          }
          std::vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>::
          emplace_back<>((vector<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                          *)local_1e0);
          pLVar5 = (this->m_loop_stack).
                   super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          sVar13 = (bc->str)._M_string_length;
          pLVar5[-1].value_name.data_ = (bc->str)._M_dataplus._M_p;
          pLVar5[-1].value_name.size_ = sVar13;
          pbVar4 = (this->m_stack).
                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_100[0] = pbVar4[-1].m_type;
          local_f8 = pbVar4[-1].m_value;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(pbVar4 + -1);
          pbVar4[-1].m_type = null;
          pbVar4[-1].m_value.object = (object_t *)0x0;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_100);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_100);
          vVar2 = pLVar5[-1].values.m_type;
          pLVar5[-1].values.m_type = local_100[0];
          jVar9 = pLVar5[-1].values.m_value;
          pLVar5[-1].values.m_value = local_f8;
          local_1e8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&pLVar5[-1].values;
          local_100[0] = vVar2;
          local_f8 = jVar9;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(&pLVar5[-1].values);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_100);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_100 + 8),local_100[0]);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_110,this->m_data);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_110);
          vVar2 = pLVar5[-1].data.m_type;
          pLVar5[-1].data.m_type = local_110[0];
          jVar9 = pLVar5[-1].data.m_value;
          pLVar5[-1].data.m_value = local_108;
          local_1d8 = &pLVar5[-1].data;
          local_110[0] = vVar2;
          local_108 = jVar9;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(&pLVar5[-1].data);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                              *)local_110);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)(local_110 + 8),local_110[0]);
          pbVar4 = (this->m_stack).
                   super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          (this->m_stack).
          super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pbVar4 + -1;
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::assert_invariant(pbVar4 + -1);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::json_value::destroy((json_value *)&pbVar4[-1].m_value.boolean,pbVar4[-1].m_type);
          vVar2 = pLVar5[-1].values.m_type;
          if ((bc->value).m_type == string) {
            if (vVar2 != object) {
              pLVar43 = (this->m_loop_stack).
                        super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1;
              (this->m_loop_stack).
              super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
              ._M_impl.super__Vector_impl_data._M_finish = pLVar43;
              __gnu_cxx::new_allocator<inja::Renderer::LoopLevel>::
              destroy<inja::Renderer::LoopLevel>(local_1e0,pLVar43);
              local_278._M_unused._M_object = &local_268;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_278,"render_error","");
              local_298._0_8_ = local_298 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_298,"for key, value requires object","");
              inja_throw((string *)&local_278,(string *)local_298);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_298 + 0x10)) {
                operator_delete((void *)local_298._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_unused._0_8_ != &local_268) {
                operator_delete(local_278._M_unused._M_object);
              }
            }
            pLVar5[-1].loop_type = Map;
            pbVar32 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      ::
                      get_ref_impl<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const>
                                (&bc->value);
            paVar39 = local_1e8;
            sVar13 = pbVar32->_M_string_length;
            pLVar5[-1].key_name.data_ = (pbVar32->_M_dataplus)._M_p;
            pLVar5[-1].key_name.size_ = sVar13;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::begin((iterator *)&local_278,
                    (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                     *)local_1e8);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::end((iterator *)local_298,
                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                   *)paVar39);
            bVar46 = nlohmann::detail::
                     iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                     ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)&local_278,(iterator *)local_298);
            if (!bVar46) {
              do {
                __args = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         ::key((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                *)&local_278);
                local_2b8 = (undefined1  [8])
                            nlohmann::detail::
                            iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                            ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                         *)&local_278);
                std::
                vector<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>,std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>>
                ::
                emplace_back<std::__cxx11::string_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>
                          ((vector<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>,std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>>
                            *)&pLVar5[-1].map_values,__args,
                           (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            **)local_2b8);
                nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                              *)&local_278);
                bVar46 = nlohmann::detail::
                         iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                         ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                       *)&local_278,
                                      (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                       *)local_298);
              } while (!bVar46);
            }
            ppVar10 = pLVar5[-1].map_values.
                      super__Vector_base<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>,_std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            ppVar11 = pLVar5[-1].map_values.
                      super__Vector_base<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>,_std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            if (ppVar10 != ppVar11) {
              uVar37 = ((long)ppVar11 - (long)ppVar10 >> 3) * -0x5555555555555555;
              lVar26 = 0x3f;
              if (uVar37 != 0) {
                for (; uVar37 >> lVar26 == 0; lVar26 = lVar26 + -1) {
                }
              }
              std::
              __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>*,std::vector<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>,std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<inja::Renderer::render_to(std::ostream&,inja::Template_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)::_lambda(std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>const&,std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>const&)_1_>>
                        (ppVar10,ppVar11,((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
              std::
              __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>*,std::vector<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>,std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>>>>,__gnu_cxx::__ops::_Iter_comp_iter<inja::Renderer::render_to(std::ostream&,inja::Template_const&,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>const&)::_lambda(std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>const&,std::pair<nonstd::sv_lite::basic_string_view<char,std::char_traits<char>>,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>*>const&)_1_>>
                        (ppVar10,ppVar11);
            }
            pLVar5[-1].map_it._M_current =
                 pLVar5[-1].map_values.
                 super__Vector_base<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>,_std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            if (vVar2 != array) {
              pLVar43 = (this->m_loop_stack).
                        super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -1;
              (this->m_loop_stack).
              super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
              ._M_impl.super__Vector_impl_data._M_finish = pLVar43;
              __gnu_cxx::new_allocator<inja::Renderer::LoopLevel>::
              destroy<inja::Renderer::LoopLevel>(local_1e0,pLVar43);
              local_278._M_unused._M_object = &local_268;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_278,"render_error","");
              local_298._0_8_ = local_298 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_298,"type must be array","");
              inja_throw((string *)&local_278,(string *)local_298);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_298._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_298 + 0x10)) {
                operator_delete((void *)local_298._0_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_278._M_unused._0_8_ != &local_268) {
                operator_delete(local_278._M_unused._M_object);
              }
            }
            pLVar5[-1].loop_type = Array;
            pLVar5[-1].index = 0;
            vVar2 = pLVar5[-1].values.m_type;
            uVar37 = (ulong)vVar2;
            if (vVar2 != null) {
              if (vVar2 == object) {
                uVar37 = ((pLVar5[-1].values.m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                         _M_node_count;
              }
              else if (vVar2 == array) {
                paVar6 = pLVar5[-1].values.m_value.array;
                uVar37 = (long)(paVar6->
                               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                         (long)(paVar6->
                               super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                               )._M_impl.super__Vector_impl_data._M_start >> 4;
              }
              else {
                uVar37 = 1;
              }
            }
            pLVar5[-1].size = uVar37;
          }
          pbVar8 = local_1d8;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
          ::find<char_const(&)[5]>
                    ((iterator *)&local_278,
                     (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      *)local_1d8,(char (*) [5])"loop");
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::end((iterator *)local_298,pbVar8);
          bVar46 = nlohmann::detail::
                   iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                   ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                 *)&local_278,(iterator *)local_298);
          if (!bVar46) {
            pbVar33 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)&local_278);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)local_298,pbVar33);
            local_150[0] = (string)local_298[0];
            local_148 = (json_value)local_298._8_8_;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_298);
            local_298._0_8_ = local_298._0_8_ & 0xffffffffffffff00;
            local_298._8_8_ = (object_t *)0x0;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_150);
            pbVar33 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                   *)&local_278);
            this_01 = nlohmann::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                      ::operator[]<char_const>
                                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                  *)pbVar33,"parent");
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_150);
            vVar2 = this_01->m_type;
            this_01->m_type = (value_t)local_150[0];
            jVar9 = this_01->m_value;
            this_01->m_value = local_148;
            local_150[0] = (string)vVar2;
            local_148 = jVar9;
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant(this_01);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_150);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::json_value::destroy((json_value *)(local_150 + 8),(value_t)local_150[0]);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                *)local_298);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::json_value::destroy((json_value *)(local_298 + 8),local_298[0]);
          }
          this->m_data = pbVar8;
          update_loop_data(this);
        }
        break;
      case EndLoop:
        if ((this->m_loop_stack).
            super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (this->m_loop_stack).
            super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_278._M_unused._M_object = &local_268;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"render_error","");
          local_298._0_8_ = local_298 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_298,"unexpected state in renderer","");
          inja_throw((string *)&local_278,(string *)local_298);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_298 + 0x10)) {
            operator_delete((void *)local_298._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_278._M_unused._0_8_ != &local_268) {
            operator_delete(local_278._M_unused._M_object);
          }
        }
        pLVar5 = (this->m_loop_stack).
                 super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (pLVar5[-1].loop_type == Array) {
          uVar24 = pLVar5[-1].index + 1;
          pLVar5[-1].index = uVar24;
          vVar2 = pLVar5[-1].values.m_type;
          uVar37 = (ulong)vVar2;
          if (vVar2 != null) {
            if (vVar2 == object) {
              uVar37 = ((pLVar5[-1].values.m_value.object)->_M_t)._M_impl.super__Rb_tree_header.
                       _M_node_count;
            }
            else if (vVar2 == array) {
              paVar6 = pLVar5[-1].values.m_value.array;
              uVar37 = (long)(paVar6->
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(paVar6->
                             super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                             )._M_impl.super__Vector_impl_data._M_start >> 4;
            }
            else {
              uVar37 = 1;
            }
          }
          bVar46 = uVar24 == uVar37;
        }
        else {
          ppVar31 = pLVar5[-1].map_it._M_current + 1;
          pLVar5[-1].map_it._M_current = ppVar31;
          bVar46 = ppVar31 ==
                   pLVar5[-1].map_values.
                   super__Vector_base<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>,_std::allocator<std::pair<nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (!bVar46) {
          update_loop_data(this);
          goto switchD_001af15a_caseD_2a;
        }
        (this->m_loop_stack).
        super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>.
        _M_impl.super__Vector_impl_data._M_finish = pLVar5 + -1;
        __gnu_cxx::new_allocator<inja::Renderer::LoopLevel>::destroy<inja::Renderer::LoopLevel>
                  (local_1e0,pLVar5 + -1);
        pLVar5 = (this->m_loop_stack).
                 super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pjVar22 = &pLVar5[-1].data;
        if ((this->m_loop_stack).
            super__Vector_base<inja::Renderer::LoopLevel,_std::allocator<inja::Renderer::LoopLevel>_>
            ._M_impl.super__Vector_impl_data._M_start == pLVar5) {
          pjVar22 = local_1a0;
        }
        this->m_data = pjVar22;
      }
      uVar45 = uVar45 + 1;
      pBVar21 = (local_158->bytecodes).
                super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar45 < (ulong)(((long)(local_158->bytecodes).
                                     super__Vector_base<inja::Bytecode,_std::allocator<inja::Bytecode>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar21 >> 3
                              ) * 0x6db6db6db6db6db7));
  }
  return;
}

Assistant:

void render_to(std::ostream& os, const Template& tmpl, const json& data) {
		m_data = &data;

		for (size_t i = 0; i < tmpl.bytecodes.size(); ++i) {
			const auto& bc = tmpl.bytecodes[i];

			switch (bc.op) {
				case Bytecode::Op::Nop: {
					break;
				}
				case Bytecode::Op::PrintText: {
					os << bc.str;
					break;
				}
				case Bytecode::Op::PrintValue: {
					const json& val = *get_args(bc)[0];
					if (val.is_string())
						os << val.get_ref<const std::string&>();
					else
						os << val.dump();
					// val.dump(os);
					pop_args(bc);
					break;
				}
				case Bytecode::Op::Push: {
					m_stack.emplace_back(*get_imm(bc));
					break;
				}
				case Bytecode::Op::Upper: {
					auto result = get_args(bc)[0]->get<std::string>();
					std::transform(result.begin(), result.end(), result.begin(), ::toupper);
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Lower: {
					auto result = get_args(bc)[0]->get<std::string>();
					std::transform(result.begin(), result.end(), result.begin(), ::tolower);
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Range: {
					int number = get_args(bc)[0]->get<int>();
					std::vector<int> result(number);
					std::iota(std::begin(result), std::end(result), 0);
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Length: {
					auto result = get_args(bc)[0]->size();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Sort: {
					auto result = get_args(bc)[0]->get<std::vector<json>>();
					std::sort(result.begin(), result.end());
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::First: {
					auto result = get_args(bc)[0]->front();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Last: {
					auto result = get_args(bc)[0]->back();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Round: {
					auto args = get_args(bc);
					double number = args[0]->get<double>();
					int precision = args[1]->get<int>();
					pop_args(bc);
					m_stack.emplace_back(std::round(number * std::pow(10.0, precision)) / std::pow(10.0, precision));
					break;
				}
				case Bytecode::Op::DivisibleBy: {
					auto args = get_args(bc);
					int number = args[0]->get<int>();
					int divisor = args[1]->get<int>();
					pop_args(bc);
					m_stack.emplace_back((divisor != 0) && (number % divisor == 0));
					break;
				}
				case Bytecode::Op::Odd: {
					int number = get_args(bc)[0]->get<int>();
					pop_args(bc);
					m_stack.emplace_back(number % 2 != 0);
					break;
				}
				case Bytecode::Op::Even: {
					int number = get_args(bc)[0]->get<int>();
					pop_args(bc);
					m_stack.emplace_back(number % 2 == 0);
					break;
				}
				case Bytecode::Op::Max: {
					auto args = get_args(bc);
					auto result = *std::max_element(args[0]->begin(), args[0]->end());
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Min: {
					auto args = get_args(bc);
					auto result = *std::min_element(args[0]->begin(), args[0]->end());
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Not: {
					bool result = !truthy(*get_args(bc)[0]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::And: {
					auto args = get_args(bc);
					bool result = truthy(*args[0]) && truthy(*args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Or: {
					auto args = get_args(bc);
					bool result = truthy(*args[0]) || truthy(*args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::In: {
					auto args = get_args(bc);
					bool result = std::find(args[1]->begin(), args[1]->end(), *args[0]) != args[1]->end();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Equal: {
					auto args = get_args(bc);
					bool result = (*args[0] == *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Greater: {
					auto args = get_args(bc);
					bool result = (*args[0] > *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Less: {
					auto args = get_args(bc);
					bool result = (*args[0] < *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::GreaterEqual: {
					auto args = get_args(bc);
					bool result = (*args[0] >= *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::LessEqual: {
					auto args = get_args(bc);
					bool result = (*args[0] <= *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Different: {
					auto args = get_args(bc);
					bool result = (*args[0] != *args[1]);
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Float: {
					double result = std::stod(get_args(bc)[0]->get_ref<const std::string&>());
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Int: {
					int result = std::stoi(get_args(bc)[0]->get_ref<const std::string&>());
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Exists: {
					auto&& name = get_args(bc)[0]->get_ref<const std::string&>();
					bool result = (data.find(name) != data.end());
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::ExistsInObject: {
					auto args = get_args(bc);
					auto&& name = args[1]->get_ref<const std::string&>();
					bool result = (args[0]->find(name) != args[0]->end());
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsBoolean: {
					bool result = get_args(bc)[0]->is_boolean();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsNumber: {
					bool result = get_args(bc)[0]->is_number();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsInteger: {
					bool result = get_args(bc)[0]->is_number_integer();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsFloat: {
					bool result = get_args(bc)[0]->is_number_float();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsObject: {
					bool result = get_args(bc)[0]->is_object();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsArray: {
					bool result = get_args(bc)[0]->is_array();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::IsString: {
					bool result = get_args(bc)[0]->is_string();
					pop_args(bc);
					m_stack.emplace_back(result);
					break;
				}
				case Bytecode::Op::Default: {
					// default needs to be a bit "magic"; we can't evaluate the first
					// argument during the push operation, so we swap the arguments during
					// the parse phase so the second argument is pushed on the stack and
					// the first argument is in the immediate
					try {
						const json* imm = get_imm(bc);
						// if no exception was raised, replace the stack value with it
						m_stack.back() = *imm;
					} catch (std::exception&) {
						// couldn't read immediate, just leave the stack as is
					}
					break;
				}
				case Bytecode::Op::Include:
					Renderer(m_included_templates, m_callbacks)
						.render_to(os, m_included_templates.find(get_imm(bc)->get_ref<const std::string&>())->second,
								   data);
					break;
				case Bytecode::Op::Callback: {
					auto callback = m_callbacks.find_callback(bc.str, bc.args);
					if (!callback) {
						inja_throw("render_error", "function '" + static_cast<std::string>(bc.str) + "' (" +
													   std::to_string(static_cast<unsigned int>(bc.args)) +
													   ") not found");
					}
					json result = callback(get_args(bc));
					pop_args(bc);
					m_stack.emplace_back(std::move(result));
					break;
				}
				case Bytecode::Op::Jump: {
					i = bc.args - 1;  // -1 due to ++i in loop
					break;
				}
				case Bytecode::Op::ConditionalJump: {
					if (!truthy(m_stack.back())) {
						i = bc.args - 1;  // -1 due to ++i in loop
					}
					m_stack.pop_back();
					break;
				}
				case Bytecode::Op::StartLoop: {
					// jump past loop body if empty
					if (m_stack.back().empty()) {
						m_stack.pop_back();
						i = bc.args;  // ++i in loop will take it past EndLoop
						break;
					}

					m_loop_stack.emplace_back();
					LoopLevel& level = m_loop_stack.back();
					level.value_name = bc.str;
					level.values = std::move(m_stack.back());
					level.data = (*m_data);
					m_stack.pop_back();

					if (bc.value.is_string()) {
						// map iterator
						if (!level.values.is_object()) {
							m_loop_stack.pop_back();
							inja_throw("render_error", "for key, value requires object");
						}
						level.loop_type = LoopLevel::Type::Map;
						level.key_name = bc.value.get_ref<const std::string&>();

						// sort by key
						for (auto it = level.values.begin(), end = level.values.end(); it != end; ++it) {
							level.map_values.emplace_back(it.key(), &it.value());
						}
						std::sort(level.map_values.begin(), level.map_values.end(),
								  [](const LoopLevel::KeyValue& a, const LoopLevel::KeyValue& b) {
									  return a.first < b.first;
								  });
						level.map_it = level.map_values.begin();
					} else {
						if (!level.values.is_array()) {
							m_loop_stack.pop_back();
							inja_throw("render_error", "type must be array");
						}

						// list iterator
						level.loop_type = LoopLevel::Type::Array;
						level.index = 0;
						level.size = level.values.size();
					}

					// provide parent access in nested loop
					auto parent_loop_it = level.data.find("loop");
					if (parent_loop_it != level.data.end()) {
						json loop_copy = *parent_loop_it;
						(*parent_loop_it)["parent"] = std::move(loop_copy);
					}

					// set "current" data to loop data
					m_data = &level.data;
					update_loop_data();
					break;
				}
				case Bytecode::Op::EndLoop: {
					if (m_loop_stack.empty()) {
						inja_throw("render_error", "unexpected state in renderer");
					}
					LoopLevel& level = m_loop_stack.back();

					bool done;
					if (level.loop_type == LoopLevel::Type::Array) {
						level.index += 1;
						done = (level.index == level.values.size());
					} else {
						level.map_it += 1;
						done = (level.map_it == level.map_values.end());
					}

					if (done) {
						m_loop_stack.pop_back();
						// set "current" data to outer loop data or main data as appropriate
						if (!m_loop_stack.empty()) {
							m_data = &m_loop_stack.back().data;
						} else {
							m_data = &data;
						}
						break;
					}

					update_loop_data();

					// jump back to start of loop
					i = bc.args - 1;  // -1 due to ++i in loop
					break;
				}
				default: {
					inja_throw("render_error",
							   "unknown op in renderer: " + std::to_string(static_cast<unsigned int>(bc.op)));
				}
			}
		}
	}